

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int pager_commit_phase1(Pager *pPager)

{
  int iVar1;
  Page *pPVar2;
  Page *p;
  int rc;
  Page *pDirty;
  Pager *pPStack_18;
  int get_excl;
  Pager *pPager_local;
  
  pDirty._4_4_ = 0;
  if (pPager->iState < 3) {
    pPager_local._4_4_ = 0;
  }
  else if (pPager->is_mem == 0) {
    pPStack_18 = pPager;
    if (pPager->is_rdonly == 0) {
      pPager_local._4_4_ = unqliteFinalizeJournal(pPager,(int *)((long)&pDirty + 4),1);
      if (pPager_local._4_4_ == 0) {
        pPVar2 = pager_get_dirty_pages(pPStack_18);
        if ((pDirty._4_4_ == 0) ||
           (pPager_local._4_4_ = pager_wait_on_lock(pPStack_18,4), pPager_local._4_4_ == 0)) {
          if ((pPStack_18->iFlags & 2U) != 0) {
            unqliteOsSync(pPStack_18->pfd,2);
          }
          iVar1 = pager_write_dirty_pages(pPStack_18,pPVar2);
          if (iVar1 == 0) {
            while (pPVar2 = pPStack_18->pAll, pPVar2 != (Page *)0x0) {
              pager_unlink_page(pPStack_18,pPVar2);
              pager_release_page(pPStack_18,pPVar2);
            }
            if (pPStack_18->dbSize != pPStack_18->dbOrigSize) {
              unqliteOsTruncate(pPStack_18->pfd,(long)pPStack_18->iPageSize * pPStack_18->dbSize);
            }
            unqliteOsSync(pPStack_18->pfd,3);
            pPStack_18->iJournalOfft = 0;
            pPStack_18->nRec = 0;
            pPager_local._4_4_ = 0;
          }
          else {
            pPStack_18->iFlags = pPStack_18->iFlags | 1;
            pPStack_18->pFirstDirty = pPVar2;
            unqliteGenError(pPStack_18->pDb,
                            "IO error while writing dirty pages, rollback your database");
            pPager_local._4_4_ = iVar1;
          }
        }
        else {
          unqliteGenError(pPStack_18->pDb,"Cannot obtain an Exclusive lock on the target database");
        }
      }
    }
    else {
      unqliteGenError(pPager->pDb,"Read-Only database");
      pPager_local._4_4_ = -0x4b;
    }
  }
  else {
    pPager_local._4_4_ = 0;
  }
  return pPager_local._4_4_;
}

Assistant:

static int pager_commit_phase1(Pager *pPager)
{
	int get_excl = 0;
	Page *pDirty;
	int rc;
	/* If no database changes have been made, return early. */
	if( pPager->iState < PAGER_WRITER_CACHEMOD ){
		return UNQLITE_OK;
	}
	if( pPager->is_mem ){
		/* An in-memory database */
		return UNQLITE_OK;
	}
	if( pPager->is_rdonly ){
		/* Read-Only DB */
		unqliteGenError(pPager->pDb,"Read-Only database");
		return UNQLITE_READ_ONLY;
	}
	/* Finalize the journal file */
	rc = unqliteFinalizeJournal(pPager,&get_excl,1);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Get the dirty pages */
	pDirty = pager_get_dirty_pages(pPager);
	if( get_excl ){
		/* Wait one last time for the exclusive lock */
		rc = pager_wait_on_lock(pPager,EXCLUSIVE_LOCK);
		if( rc != UNQLITE_OK ){
			unqliteGenError(pPager->pDb,"Cannot obtain an Exclusive lock on the target database");
			return rc;
		}
	}
	if( pPager->iFlags & PAGER_CTRL_DIRTY_COMMIT ){
		/* Sync the database first if a dirty commit have been applied */
		unqliteOsSync(pPager->pfd,UNQLITE_SYNC_NORMAL);
	}
	/* Write the dirty pages */
	rc = pager_write_dirty_pages(pPager,pDirty);
	if( rc != UNQLITE_OK ){
		/* Rollback your DB */
		pPager->iFlags |= PAGER_CTRL_COMMIT_ERR;
		pPager->pFirstDirty = pDirty;
		unqliteGenError(pPager->pDb,"IO error while writing dirty pages, rollback your database");
		return rc;
	}
	/* release all pages */
	{
		Page *p;

		while (1) {
			p = pPager->pAll;
			if (p == 0) {
				break;
			}
			pager_unlink_page(pPager, p);
			pager_release_page(pPager, p);
		}
	}
	/* If the file on disk is not the same size as the database image,
     * then use unqliteOsTruncate to grow or shrink the file here.
     */
	if( pPager->dbSize != pPager->dbOrigSize ){
		unqliteOsTruncate(pPager->pfd,pPager->iPageSize * pPager->dbSize);
	}
	/* Sync the database file */
	unqliteOsSync(pPager->pfd,UNQLITE_SYNC_FULL);
	/* Remove stale flags */
	pPager->iJournalOfft = 0;
	pPager->nRec = 0;
	return UNQLITE_OK;
}